

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_kinematics_animated(xr_ogf_v4 *this,xr_reader *r)

{
  bool bVar1;
  size_t sVar2;
  xr_reader *local_20;
  xr_reader *s;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  load_kinematics(this,r);
  sVar2 = xr_reader::find_chunk(s,0x13);
  if (sVar2 == 0) {
    sVar2 = xr_reader::find_chunk(s,0x18);
    if (sVar2 == 0) {
      local_20 = xr_reader::open_chunk(s,0xf);
      if (local_20 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x247,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
      }
      load_s_smparams(this,local_20);
      bVar1 = xr_reader::eof(local_20);
      if (!bVar1) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x249,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
      }
      xr_reader::close_chunk(s,&local_20);
      local_20 = xr_reader::open_chunk(s,0xe);
      if (local_20 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x24d,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
      }
      load_s_motions(this,local_20);
      bVar1 = xr_reader::eof(local_20);
      if (!bVar1) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x24f,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
      }
      xr_reader::close_chunk(s,&local_20);
    }
    else {
      load_s_motion_refs_1(this,s);
      xr_reader::debug_find_chunk(s);
    }
  }
  else {
    load_s_motion_refs_0(this,s);
    xr_reader::debug_find_chunk(s);
  }
  return;
}

Assistant:

void xr_ogf_v4::load_kinematics_animated(xr_reader& r)
{
	load_kinematics(r);
	if (r.find_chunk(OGF4_S_MOTION_REFS_0)) {
		load_s_motion_refs_0(r);
		r.debug_find_chunk();
	} else if (r.find_chunk(OGF4_S_MOTION_REFS_1)) {
		load_s_motion_refs_1(r);
		r.debug_find_chunk();
	} else {
		xr_reader* s = r.open_chunk(OGF4_S_SMPARAMS);
		xr_assert(s);
		load_s_smparams(*s);
		assert(s->eof());
		r.close_chunk(s);

		s = r.open_chunk(OGF4_S_MOTIONS);
		xr_assert(s);
		load_s_motions(*s);
		assert(s->eof());
		r.close_chunk(s);
	}
}